

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsolve.hpp
# Opt level: O1

Status __thiscall
soplex::SPxSolverBase<double>::getRedCostSol
          (SPxSolverBase<double> *this,VectorBase<double> *p_vector)

{
  pointer pdVar1;
  Status *pSVar2;
  pointer pdVar3;
  UpdateVector<double> *pUVar4;
  SPxId *pSVar5;
  double dVar6;
  int iVar7;
  Status SVar8;
  long lVar9;
  undefined8 *puVar10;
  ulong uVar11;
  long lVar12;
  uint uVar13;
  vector<double,_std::allocator<double>_> *__range2;
  DataKey local_70;
  double local_68;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  DataKey local_50;
  long local_48;
  undefined1 local_40 [16];
  
  if (this->initialized == false) {
    puVar10 = (undefined8 *)__cxa_allocate_exception(0x28);
    local_50 = (DataKey)local_40;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,"XSOLVE09 No Problem loaded","");
    *puVar10 = &PTR__SPxException_006a9ee8;
    puVar10[1] = puVar10 + 3;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(puVar10 + 1),local_50,(undefined1 *)(local_48 + (long)local_50));
    *puVar10 = &PTR__SPxException_006aa100;
    __cxa_throw(puVar10,&SPxStatusException::typeinfo,SPxException::~SPxException);
  }
  if (this->theRep == ROW) {
    pdVar1 = (p_vector->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar3 = (p_vector->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (pdVar1 != pdVar3) {
      memset(pdVar1,0,(long)pdVar3 - (long)pdVar1 & 0xfffffffffffffff8);
    }
    uVar13 = (this->thecovectors->set).thenum;
    if ((this->super_SPxLPBase<double>).thesense == MINIMIZE) {
      if (0 < (int)uVar13) {
        lVar9 = (ulong)uVar13 + 1;
        do {
          pSVar5 = (this->super_SPxBasisBase<double>).theBaseId.data;
          if (0 < pSVar5[lVar9 + -2].super_DataKey.info) {
            local_68 = -(this->theFvec->super_VectorBase<double>).val.
                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar9 + 0xfffffffffffffffe];
            uStack_60 = 0;
            uStack_5c = 0x80000000;
            local_70 = pSVar5[lVar9 + -2].super_DataKey;
            SPxColId::SPxColId((SPxColId *)&local_50,(SPxId *)&local_70);
            iVar7 = ClassSet<soplex::SVSetBase<double>::DLPSV>::number
                              (&(this->super_SPxLPBase<double>).super_LPColSetBase<double>.
                                super_SVSetBase<double>.set,&local_50);
            (p_vector->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[iVar7] = local_68;
          }
          lVar9 = lVar9 + -1;
        } while (1 < lVar9);
      }
    }
    else if (0 < (int)uVar13) {
      lVar9 = (ulong)uVar13 + 1;
      do {
        pSVar5 = (this->super_SPxBasisBase<double>).theBaseId.data;
        if (0 < pSVar5[lVar9 + -2].super_DataKey.info) {
          local_68 = (this->theFvec->super_VectorBase<double>).val.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar9 + 0xfffffffffffffffe];
          local_70 = pSVar5[lVar9 + -2].super_DataKey;
          SPxColId::SPxColId((SPxColId *)&local_50,(SPxId *)&local_70);
          iVar7 = ClassSet<soplex::SVSetBase<double>::DLPSV>::number
                            (&(this->super_SPxLPBase<double>).super_LPColSetBase<double>.
                              super_SVSetBase<double>.set,&local_50);
          (p_vector->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[iVar7] = local_68;
        }
        lVar9 = lVar9 + -1;
      } while (1 < lVar9);
    }
  }
  else {
    lVar9 = (long)(this->super_SPxLPBase<double>).super_LPColSetBase<double>.super_SVSetBase<double>
                  .set.thenum;
    if (0 < lVar9) {
      pdVar1 = (this->super_SPxLPBase<double>).super_LPColSetBase<double>.object.val.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start;
      pSVar2 = (this->super_SPxBasisBase<double>).thedesc.colstat.data;
      pdVar3 = (p_vector->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pUVar4 = this->thePvec;
      lVar12 = 0;
      do {
        uVar13 = pSVar2[lVar12] + P_FREE;
        if ((7 < uVar13) || (dVar6 = 0.0, (0xabU >> (uVar13 & 0x1f) & 1) == 0)) {
          dVar6 = pdVar1[lVar12] -
                  (pUVar4->super_VectorBase<double>).val.
                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar12];
        }
        pdVar3[lVar12] = dVar6;
        lVar12 = lVar12 + 1;
      } while (lVar9 != lVar12);
    }
    if ((this->super_SPxLPBase<double>).thesense == MINIMIZE) {
      pdVar1 = (p_vector->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar13 = (uint)((ulong)((long)(p_vector->val).
                                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                    super__Vector_impl_data._M_finish - (long)pdVar1) >> 3);
      if (0 < (int)uVar13) {
        uVar11 = 0;
        do {
          pdVar1[uVar11] = -pdVar1[uVar11];
          uVar11 = uVar11 + 1;
        } while ((uVar13 & 0x7fffffff) != uVar11);
      }
    }
  }
  SVar8 = status(this);
  return SVar8;
}

Assistant:

typename SPxSolverBase<R>::Status SPxSolverBase<R>::getRedCostSol(VectorBase<R>& p_vector) const
{

   assert(isInitialized());

   if(!isInitialized())
   {
      throw SPxStatusException("XSOLVE09 No Problem loaded");
      // return NOT_INIT;
   }

   if(rep() == ROW)
   {
      int i;
      p_vector.clear();

      if(this->spxSense() == SPxLPBase<R>::MINIMIZE)
      {
         for(i = dim() - 1; i >= 0; --i)
         {
            if(this->baseId(i).isSPxColId())
               p_vector[ this->number(SPxColId(this->baseId(i))) ] = -fVec()[i];
         }
      }
      else
      {
         for(i = dim() - 1; i >= 0; --i)
         {
            if(this->baseId(i).isSPxColId())
               p_vector[ this->number(SPxColId(this->baseId(i))) ] = fVec()[i];
         }
      }
   }
   else
   {
      const typename SPxBasisBase<R>::Desc& ds = this->desc();

      for(int i = 0; i < this->nCols(); ++i)
      {
         switch(ds.colStatus(i))
         {
         case SPxBasisBase<R>::Desc::D_FREE:
         case SPxBasisBase<R>::Desc::D_ON_UPPER:
         case SPxBasisBase<R>::Desc::D_ON_LOWER:
         case SPxBasisBase<R>::Desc::D_ON_BOTH:
         case SPxBasisBase<R>::Desc::D_UNDEFINED:
            p_vector[i] = 0;
            break;

         default:
            p_vector[i] = this->maxObj()[i] - (*thePvec)[i];
         }
      }

      if(this->spxSense() == SPxLPBase<R>::MINIMIZE)
         p_vector *= -1.0;
   }

   return status();
}